

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O0

bool __thiscall
HSet::setup(HSet *this,HighsInt size,HighsInt max_entry,bool output_flag,FILE *log_file,bool debug,
           bool allow_assert)

{
  byte in_CL;
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  size_type in_R8;
  undefined4 in_R9D;
  byte in_stack_00000008;
  undefined4 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  *(undefined1 *)(in_RDI + 8) = 0;
  if (in_ESI < 1) {
    local_1 = false;
  }
  else if (in_EDX < 0) {
    local_1 = false;
  }
  else {
    in_RDI[0xc] = in_EDX;
    *(byte *)((long)in_RDI + 0x21) = (byte)in_R9D & 1;
    *(byte *)((long)in_RDI + 0x22) = in_stack_00000008 & 1;
    *(byte *)((long)in_RDI + 0x23) = in_CL & 1;
    *(size_type *)(in_RDI + 10) = in_R8;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               (CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),in_R8);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),
               CONCAT44(in_R9D,in_stack_ffffffffffffffb8),(value_type_conflict2 *)0x7f5d4c);
    *in_RDI = 0;
    *(undefined1 *)(in_RDI + 8) = 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool HSet::setup(const HighsInt size, const HighsInt max_entry,
                 const bool output_flag, FILE* log_file, const bool debug,
                 const bool allow_assert) {
  setup_ = false;
  if (size <= 0) return false;
  if (max_entry < min_entry) return false;
  max_entry_ = max_entry;
  debug_ = debug;
  allow_assert_ = allow_assert;
  output_flag_ = output_flag;
  log_file_ = log_file;
  entry_.resize(size);
  pointer_.assign(max_entry_ + 1, no_pointer);
  count_ = 0;
  setup_ = true;
  return true;
}